

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnd_timedwait.c
# Opt level: O0

int cnd_timedwait(cnd_t *cond,mtx_t *mtx,timespec *ts)

{
  int iVar1;
  timespec *ts_local;
  mtx_t *mtx_local;
  cnd_t *cond_local;
  
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)cond,(pthread_mutex_t *)mtx,(timespec *)ts);
  if (iVar1 == 0) {
    cond_local._4_4_ = 1;
  }
  else if (iVar1 == 0x6e) {
    cond_local._4_4_ = 0;
  }
  else {
    cond_local._4_4_ = 3;
  }
  return cond_local._4_4_;
}

Assistant:

int cnd_timedwait( cnd_t * _PDCLIB_restrict cond, mtx_t * _PDCLIB_restrict mtx, const struct timespec * _PDCLIB_restrict ts )
{
    switch ( pthread_cond_timedwait( cond, mtx, ts ) )
    {
        case 0:
            return thrd_success;

        case ETIMEDOUT:
            return thrd_timedout;

        default:
            return thrd_error;
    }
}